

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

string_t __thiscall
duckdb::SHA1Operator::Operation<duckdb::string_t,duckdb::string_t>
          (SHA1Operator *this,string_t input,Vector *result)

{
  char *out;
  anon_union_16_2_67f50693_for_value aVar1;
  SHA1State state;
  string_t hash;
  string local_48;
  string_t input_local;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  input_local.value._0_8_ = this;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,(Vector *)0x28,(idx_t)input.value._8_8_);
  hash.value = (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer
  ;
  duckdb_mbedtls::MbedTlsWrapper::SHA1State::SHA1State(&state);
  string_t::GetString_abi_cxx11_(&local_48,&input_local);
  duckdb_mbedtls::MbedTlsWrapper::SHA1State::AddString(&state,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  out = aVar1.pointer.ptr;
  if (aVar1.pointer.length < 0xd) {
    out = hash.value.pointer.prefix;
  }
  duckdb_mbedtls::MbedTlsWrapper::SHA1State::FinishHex(&state,out);
  string_t::Finalize(&hash);
  duckdb_mbedtls::MbedTlsWrapper::SHA1State::~SHA1State(&state);
  return (string_t)hash.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto hash = StringVector::EmptyString(result, duckdb_mbedtls::MbedTlsWrapper::SHA1_HASH_LENGTH_TEXT);

		duckdb_mbedtls::MbedTlsWrapper::SHA1State state;
		state.AddString(input.GetString());
		state.FinishHex(hash.GetDataWriteable());

		hash.Finalize();
		return hash;
	}